

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errorHandle.cpp
# Opt level: O0

void __thiscall blc::error::exception::exception(exception *this,string *msg)

{
  ostream *poVar1;
  string *in_RSI;
  exception *in_RDI;
  string *this_00;
  ostringstream oss;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  ostringstream local_198 [378];
  allocator<char> local_1e;
  allocator<char> local_1d [29];
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__exception_00130958;
  this_00 = (string *)(in_RDI + 8);
  std::__cxx11::string::string(this_00,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(allocator<char> *)this_00);
  std::allocator<char>::~allocator(local_1d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(allocator<char> *)this_00);
  std::allocator<char>::~allocator(&local_1e);
  *(undefined4 *)(in_RDI + 0x68) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x70) = 0xffffffffffffffff;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Error : ");
  std::operator<<(poVar1,in_RSI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)(in_RDI + 8),(string *)&stack0xfffffffffffffe48);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

blc::error::exception::exception(std::string msg) : _msg(msg), _file("ND"), _func("ND"), _line(-1), _time(-1) {
	std::ostringstream oss;

	oss << "Error : " << msg;
	this->_msg = oss.str();
}